

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O0

char * __thiscall DArgs::CheckValue(DArgs *this,char *check)

{
  int iVar1;
  uint uVar2;
  FString *pFVar3;
  char *pcVar4;
  int i;
  char *check_local;
  DArgs *this_local;
  
  iVar1 = CheckParm(this,check,1);
  if ((0 < iVar1) && (uVar2 = TArray<FString,_FString>::Size(&this->Argv), iVar1 < (int)(uVar2 - 1))
     ) {
    iVar1 = iVar1 + 1;
    pFVar3 = TArray<FString,_FString>::operator[](&this->Argv,(long)iVar1);
    pcVar4 = FString::operator[](pFVar3,0);
    if (*pcVar4 != '+') {
      pFVar3 = TArray<FString,_FString>::operator[](&this->Argv,(long)iVar1);
      pcVar4 = FString::operator[](pFVar3,0);
      if (*pcVar4 != '-') {
        pFVar3 = TArray<FString,_FString>::operator[](&this->Argv,(long)iVar1);
        pcVar4 = FString::GetChars(pFVar3);
        return pcVar4;
      }
    }
    return (char *)0x0;
  }
  return (char *)0x0;
}

Assistant:

const char *DArgs::CheckValue(const char *check) const
{
	int i = CheckParm(check);

	if (i > 0 && i < (int)Argv.Size() - 1)
	{
		i++;
		return Argv[i][0] != '+' && Argv[i][0] != '-' ? Argv[i].GetChars() : NULL;
	}
	else
	{
		return NULL;
	}
}